

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shm.c
# Opt level: O0

QcShm * qc_shm_create(char *name,size_t shmsize,QcErr *err)

{
  int __fd;
  int iVar1;
  uint *puVar2;
  void *pvVar3;
  QcShm *qcShm;
  char *addr;
  size_t size;
  mode_t perms;
  int fd;
  int opt;
  int flags;
  QcErr *err_local;
  size_t shmsize_local;
  char *name_local;
  
  shm_unlink(name);
  __fd = shm_open(name,0xc2,0x180);
  if (__fd == -1) {
    puVar2 = (uint *)__errno_location();
    qc_seterr(err,-1,"create shm failed, name : %s errno=%d\n",name,(ulong)*puVar2);
    name_local = (char *)0x0;
  }
  else {
    iVar1 = ftruncate(__fd,shmsize);
    if (iVar1 == -1) {
      puVar2 = (uint *)__errno_location();
      qc_seterr(err,-1,"ftruncate failed. errno=%d\n",(ulong)*puVar2);
      name_local = (char *)0x0;
    }
    else {
      pvVar3 = mmap((void *)0x0,shmsize,3,1,__fd,0);
      if (pvVar3 == (void *)0xffffffffffffffff) {
        puVar2 = (uint *)__errno_location();
        qc_seterr(err,-1,"mmap faied, errno=%d\n",(ulong)*puVar2);
        name_local = (char *)0x0;
      }
      else {
        close(__fd);
        name_local = (char *)malloc(0x98);
        if (name_local == (char *)0x0) {
          fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_shm.c"
                  ,0x51);
          __assert_fail("qcShm",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_shm.c"
                        ,0x51,"QcShm *qc_shm_create(const char *, size_t, QcErr *)");
        }
        memset(name_local,0,0x98);
        strncpy(name_local,name,0x80);
        *(void **)(name_local + 0x88) = pvVar3;
        *(size_t *)(name_local + 0x90) = shmsize;
      }
    }
  }
  return (QcShm *)name_local;
}

Assistant:

QcShm* qc_shm_create(const char *name, size_t shmsize, QcErr *err)
{
    int flags, opt, fd;
    mode_t perms;
    size_t size;
    char *addr;

    flags = O_CREAT|O_EXCL|O_RDWR;
    perms = S_IRUSR|S_IWUSR;

    //unlink shm first?
    shm_unlink(name);

    fd = shm_open(name, flags, perms);
    if(fd == -1)
    {
        qc_seterr(err, -1, "create shm failed, name : %s errno=%d\n", name, errno);
        return NULL;
    }

    if(ftruncate(fd, shmsize) == -1)
    {
        qc_seterr(err, -1, "ftruncate failed. errno=%d\n", errno);
        return NULL;
    }

    addr = mmap(NULL, shmsize, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    if(addr == MAP_FAILED)
    {
        qc_seterr(err, -1, "mmap faied, errno=%d\n", errno);
        return NULL;
    }

    close(fd);

    QcShm *qcShm;
    qc_malloc(qcShm, sizeof(QcShm));
    strncpy(qcShm->name, name, QC_SHMNAME_MAXLEN);
    qcShm->shmaddr = addr;
    qcShm->shmsize = shmsize;

    return qcShm;
}